

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::ValidateResourceViewDimension<Diligent::BufferViewVkImpl>
               (char *ResName,Uint32 ArraySize,Uint32 ArrayInd,BufferViewVkImpl *pViewImpl,
               RESOURCE_DIMENSION ExpectedResourceDim,bool IsMultisample)

{
  char (*Args_8) [2];
  undefined7 in_register_00000081;
  String local_60;
  string msg;
  Char *local_20;
  
  if (RESOURCE_DIM_BUFFER < ExpectedResourceDim) {
    GetShaderResourcePrintName_abi_cxx11_
              (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,
               (Uint32)CONCAT71(in_register_00000081,ExpectedResourceDim));
    Args_8 = (char (*) [2])GetResourceDimString(RESOURCE_DIM_BUFFER);
    local_20 = GetResourceDimString(ExpectedResourceDim);
    FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
              (&msg,(Diligent *)"The dimension of resource view \'",
               (char (*) [33])
               &(pViewImpl->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\' is ",
               (char (*) [6])&stack0xffffffffffffff98,
               (char **)", but resource dimension expected by the shader is ",
               (char (*) [52])&local_20,(char **)0x75a69e,Args_8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x177);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return ExpectedResourceDim < RESOURCE_DIM_TEX_1D;
}

Assistant:

bool ValidateResourceViewDimension(const char*                ResName,
                                   Uint32                     ArraySize,
                                   Uint32                     ArrayInd,
                                   const TextureViewImplType* pViewImpl,
                                   RESOURCE_DIMENSION         ExpectedResourceDim,
                                   bool                       IsMultisample)
{
    bool BindingsOK = true;

    if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED)
    {
        const RESOURCE_DIMENSION ResourceDim = GetResourceViewDimension(pViewImpl);
        if (ResourceDim != ExpectedResourceDim)
        {
            RESOURCE_VALIDATION_FAILURE("The dimension of resource view '", pViewImpl->GetDesc().Name,
                                        "' bound to variable '", GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is ", GetResourceDimString(ResourceDim),
                                        ", but resource dimension expected by the shader is ", GetResourceDimString(ExpectedResourceDim), ".");
            BindingsOK = false;
        }

        if (ResourceDim == RESOURCE_DIM_TEX_2D || ResourceDim == RESOURCE_DIM_TEX_2D_ARRAY)
        {
            Uint32 SampleCount = GetResourceSampleCount(pViewImpl);
            if (IsMultisample && SampleCount == 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: multisample texture is expected.");
                BindingsOK = false;
            }
            else if (!IsMultisample && SampleCount > 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: single-sample texture is expected.");
                BindingsOK = false;
            }
        }
    }

    return BindingsOK;
}